

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

vector_t *** alloc_acc(gauden_t *g,uint32 n_id)

{
  uint uVar1;
  uint32 uVar2;
  void *pvVar3;
  vector_t ***ppppfVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  
  uVar8 = 0;
  iVar10 = 0;
  if ((ulong)g->n_feat != 0) {
    uVar5 = 0;
    iVar10 = 0;
    do {
      iVar10 = iVar10 + g->veclen[uVar5] * g->n_density;
      uVar5 = uVar5 + 1;
    } while (g->n_feat != uVar5);
  }
  pvVar3 = __ckd_calloc__((ulong)(iVar10 * n_id),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x21c);
  ppppfVar4 = (vector_t ***)
              __ckd_calloc_3d__((ulong)n_id,(ulong)g->n_feat,(ulong)g->n_density,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0x221);
  if (n_id != 0) {
    uVar1 = g->n_feat;
    uVar5 = 0;
    uVar9 = 0;
    do {
      if ((ulong)uVar1 != 0) {
        uVar8 = g->n_density;
        uVar6 = 0;
        do {
          if ((ulong)uVar8 != 0) {
            uVar2 = g->veclen[uVar6];
            uVar7 = 0;
            do {
              ppppfVar4[uVar5][uVar6][uVar7] = (vector_t)((long)pvVar3 + uVar9 * 4);
              uVar9 = (ulong)((int)uVar9 + uVar2);
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar1);
      }
      uVar8 = (uint)uVar9;
      uVar5 = uVar5 + 1;
    } while (uVar5 != n_id);
  }
  if (uVar8 == iVar10 * n_id) {
    return ppppfVar4;
  }
  __assert_fail("l == tl",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x230,"vector_t ***alloc_acc(gauden_t *, uint32)");
}

Assistant:

static vector_t ***
alloc_acc(gauden_t *g, uint32 n_id)
{
    uint32 i, j, k, l, vl, tl;
    float32 *b;
    vector_t ***out;

    for (i = 0, tl = 0; i < g->n_feat; i++) {
	tl += g->n_density * g->veclen[i];
    }

    tl *= n_id;

    b = ckd_calloc(tl, sizeof(float32));

    out = (vector_t ***) ckd_calloc_3d(n_id,
				      g->n_feat,
				      g->n_density,
				      sizeof(vector_t));

    for (i = 0, l = 0; i < n_id; i++) {
	for (j = 0; j < g->n_feat; j++) {

	    vl = g->veclen[j];

	    for (k = 0; k < g->n_density; k++) {
		out[i][j][k] = &b[l];
		
		l += vl;
	    }
	}
    }

    assert(l == tl);

    return out;
}